

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse_stages
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,Value *stages,
          VkPipelineShaderStageCreateInfo **out_info)

{
  __node_base_ptr p_Var1;
  size_t size;
  undefined8 uVar2;
  StateCreatorInterface *pSVar3;
  Impl *this_00;
  DatabaseInterface *resolver_00;
  bool bVar4;
  SizeType SVar5;
  int iVar6;
  ulong uVar7;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar8;
  Type pGVar9;
  Ch *pCVar10;
  char *__dest;
  Number NVar11;
  VkShaderModule pVVar12;
  __node_base_ptr p_Var13;
  ulong uVar14;
  VkPipelineShaderStageCreateInfo *pVVar15;
  __node_base_ptr p_Var16;
  __hash_code __code;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_01;
  _Hash_node_base *p_Var17;
  long *in_FS_OFFSET;
  bool bVar18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> external_state;
  size_t external_state_size;
  allocator_type local_81;
  Data local_80;
  long local_70;
  VkPipelineShaderStageCreateInfo *local_68;
  StateCreatorInterface *local_60;
  Impl *local_58;
  size_type local_50;
  VkPipelineShaderStageCreateInfo **local_48;
  DatabaseInterface *local_40;
  Value *local_38;
  
  local_58 = this;
  if ((stages->data_).f.flags != 4) {
    __assert_fail("IsArray()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x66a,
                  "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::Size() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  uVar7 = (ulong)(stages->data_).s.length;
  local_48 = out_info;
  if (uVar7 == 0) {
    local_68 = (VkPipelineShaderStageCreateInfo *)0x0;
  }
  else {
    size = uVar7 * 0x30;
    local_68 = (VkPipelineShaderStageCreateInfo *)
               ScratchAllocator::allocate_raw(&this->allocator,size,0x10);
    if (local_68 != (VkPipelineShaderStageCreateInfo *)0x0) {
      memset(local_68,0,size);
    }
  }
  local_40 = resolver;
  if ((stages->data_).f.flags != 4) {
    __assert_fail("IsArray()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x68c,
                  "ValueIterator rapidjson::GenericValue<rapidjson::UTF8<>>::Begin() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  this_01 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)((ulong)(stages->data_).s.str & 0xffffffffffff);
  pGVar8 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            *)rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::End(stages);
  bVar18 = pGVar8 == this_01;
  local_60 = iface;
  local_38 = stages;
  pVVar15 = local_68;
  do {
    if (bVar18) {
      *local_48 = local_68;
      return bVar18;
    }
    pVVar15->sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
    pGVar9 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_01,"flags");
    if ((undefined1  [16])((undefined1  [16])pGVar9->data_ & (undefined1  [16])0x40000000000000) ==
        (undefined1  [16])0x0) {
LAB_00127823:
      __assert_fail("data_.f.flags & kUintFlag",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                    ,0x719,
                    "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
    pVVar15->flags = (pGVar9->data_).s.length;
    pGVar9 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_01,"stage");
    if ((undefined1  [16])((undefined1  [16])pGVar9->data_ & (undefined1  [16])0x40000000000000) ==
        (undefined1  [16])0x0) goto LAB_00127823;
    pVVar15->stage = (pGVar9->data_).s.length;
    pGVar9 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_01,"name");
    pCVar10 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetString(pGVar9);
    pGVar9 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_01,"name");
    SVar5 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetStringLength(pGVar9);
    this_00 = local_58;
    uVar7 = (ulong)SVar5;
    __dest = (char *)ScratchAllocator::allocate_raw(&local_58->allocator,uVar7 + 1,0x10);
    memcpy(__dest,pCVar10,uVar7);
    __dest[uVar7] = '\0';
    pVVar15->pName = __dest;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_80.s,(Ch *)this_01);
    uVar2 = local_80.n;
    NVar11.i = (I)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               *)this_01);
    if (uVar2 != NVar11.i64) {
      pGVar9 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_01,"specializationInfo");
      parse_specialization_info(this_00,pGVar9,&pVVar15->pSpecializationInfo);
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_80.s,(Ch *)this_01);
    uVar2 = local_80.n;
    NVar11.i = (I)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               *)this_01);
    if (uVar2 != NVar11.i64) {
      pGVar9 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_01,"pNext");
      bVar4 = parse_pnext_chain(this_00,pGVar9,&pVVar15->pNext,(StateCreatorInterface *)0x0,
                                (DatabaseInterface *)0x0,(Value *)0x0);
      if (!bVar4) {
        return bVar18;
      }
    }
    pGVar9 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(this_01,"module");
    pCVar10 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetString(pGVar9);
    pVVar12 = (VkShaderModule)strtoull(pCVar10,(char **)0x0,0x10);
    resolver_00 = local_40;
    if ((pVVar12 != (VkShaderModule)0x0) && (this_00->resolve_shader_modules == true)) {
      uVar7 = (this_00->replayed_shader_modules)._M_h._M_bucket_count;
      uVar14 = (ulong)pVVar12 % uVar7;
      p_Var1 = (this_00->replayed_shader_modules)._M_h._M_buckets[uVar14];
      p_Var13 = (__node_base_ptr)0x0;
      if ((p_Var1 != (__node_base_ptr)0x0) &&
         (p_Var13 = p_Var1, p_Var16 = p_Var1->_M_nxt,
         pVVar12 != (VkShaderModule)p_Var1->_M_nxt[1]._M_nxt)) {
        while (p_Var17 = p_Var16->_M_nxt, p_Var17 != (_Hash_node_base *)0x0) {
          p_Var13 = (__node_base_ptr)0x0;
          if (((ulong)p_Var17[1]._M_nxt % uVar7 != uVar14) ||
             (p_Var13 = p_Var16, p_Var16 = p_Var17, pVVar12 == (VkShaderModule)p_Var17[1]._M_nxt))
          goto LAB_001275ab;
        }
        p_Var13 = (__node_base_ptr)0x0;
      }
LAB_001275ab:
      if (p_Var13 == (__node_base_ptr)0x0) {
        p_Var17 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var17 = p_Var13->_M_nxt;
      }
      if (p_Var17 == (_Hash_node_base *)0x0) {
        local_50 = 0;
        if ((local_40 == (DatabaseInterface *)0x0) ||
           (iVar6 = (*local_40->_vptr_DatabaseInterface[3])(local_40,4,pVVar12,&local_50,0),
           (char)iVar6 == '\0')) {
          if (1 < *(int *)(*in_FS_OFFSET + -0x18)) {
            return bVar18;
          }
          bVar4 = Internal::log_thread_callback
                            (LOG_DEFAULT,
                             "Referenced %s %016lx, but it does not exist.\nThis can be expected when replaying an archive from Steam.\nIf replaying just the application cache, make sure to replay together with the common cache, as application cache can depend on common cache.\n"
                             ,"Shader module",pVVar12);
          if (bVar4) {
            return bVar18;
          }
          fprintf(_stderr,
                  "Fossilize WARN: Referenced %s %016lx, but it does not exist.\nThis can be expected when replaying an archive from Steam.\nIf replaying just the application cache, make sure to replay together with the common cache, as application cache can depend on common cache.\n"
                  ,"Shader module",pVVar12);
          return bVar18;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80.s,local_50,
                   &local_81);
        iVar6 = (*resolver_00->_vptr_DatabaseInterface[3])
                          (resolver_00,4,pVVar12,&local_50,local_80.n.i64);
        pSVar3 = local_60;
        if ((char)iVar6 != '\0') {
          bVar4 = parse(this_00,local_60,resolver_00,(void *)local_80.n,
                        (long)local_80.s.str - local_80._0_8_);
          if (!bVar4) goto LAB_001277cd;
          (**(code **)(*(long *)pSVar3 + 0x78))(pSVar3);
          uVar7 = (this_00->replayed_shader_modules)._M_h._M_bucket_count;
          uVar14 = (ulong)pVVar12 % uVar7;
          p_Var1 = (this_00->replayed_shader_modules)._M_h._M_buckets[uVar14];
          p_Var13 = (__node_base_ptr)0x0;
          if ((p_Var1 != (__node_base_ptr)0x0) &&
             (p_Var13 = p_Var1, p_Var16 = p_Var1->_M_nxt,
             pVVar12 != (VkShaderModule)p_Var1->_M_nxt[1]._M_nxt)) {
            while (p_Var17 = p_Var16->_M_nxt, p_Var17 != (_Hash_node_base *)0x0) {
              p_Var13 = (__node_base_ptr)0x0;
              if (((ulong)p_Var17[1]._M_nxt % uVar7 != uVar14) ||
                 (p_Var13 = p_Var16, p_Var16 = p_Var17, pVVar12 == (VkShaderModule)p_Var17[1]._M_nxt
                 )) goto LAB_001276d3;
            }
            p_Var13 = (__node_base_ptr)0x0;
          }
LAB_001276d3:
          if (p_Var13 == (__node_base_ptr)0x0) {
            p_Var17 = (_Hash_node_base *)0x0;
          }
          else {
            p_Var17 = p_Var13->_M_nxt;
          }
          if (p_Var17 != (_Hash_node_base *)0x0) {
            if (local_80.n.i64 != 0) {
              operator_delete((void *)local_80.n,local_70 - local_80._0_8_);
            }
            goto LAB_00127700;
          }
        }
        if ((*(int *)(*in_FS_OFFSET + -0x18) < 2) &&
           (bVar4 = Internal::log_thread_callback
                              (LOG_DEFAULT,
                               "Referenced %s %016lx, but it does not exist.\nThis can be expected when replaying an archive from Steam.\nIf replaying just the application cache, make sure to replay together with the common cache, as application cache can depend on common cache.\n"
                               ,"Shader module",pVVar12), !bVar4)) {
          fprintf(_stderr,
                  "Fossilize WARN: Referenced %s %016lx, but it does not exist.\nThis can be expected when replaying an archive from Steam.\nIf replaying just the application cache, make sure to replay together with the common cache, as application cache can depend on common cache.\n"
                  ,"Shader module",pVVar12);
        }
LAB_001277cd:
        if (local_80.n.i64 == 0) {
          return bVar18;
        }
        operator_delete((void *)local_80.n,local_70 - local_80._0_8_);
        return bVar18;
      }
      (**(code **)(*(long *)local_60 + 0x78))();
LAB_00127700:
      pVVar12 = (VkShaderModule)p_Var17[2]._M_nxt;
    }
    pVVar15->module = pVVar12;
    this_01 = this_01 + 0x10;
    pVVar15 = pVVar15 + 1;
    pGVar8 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::End(local_38);
    bVar18 = this_01 == pGVar8;
  } while( true );
}

Assistant:

bool StateReplayer::Impl::parse_stages(StateCreatorInterface &iface, DatabaseInterface *resolver, const Value &stages,
                                       const VkPipelineShaderStageCreateInfo **out_info)
{
	auto *state = allocator.allocate_n_cleared<VkPipelineShaderStageCreateInfo>(stages.Size());
	auto *ret = state;

	for (auto itr = stages.Begin(); itr != stages.End(); ++itr, state++)
	{
		auto &obj = *itr;
		state->sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
		state->flags = obj["flags"].GetUint();
		state->stage = static_cast<VkShaderStageFlagBits>(obj["stage"].GetUint());
		state->pName = duplicate_string(obj["name"].GetString(), obj["name"].GetStringLength());
		if (obj.HasMember("specializationInfo"))
			if (!parse_specialization_info(obj["specializationInfo"], &state->pSpecializationInfo))
				return false;

		if (obj.HasMember("pNext"))
			if (!parse_pnext_chain(obj["pNext"], &state->pNext))
				return false;

		auto module = string_to_uint64(obj["module"].GetString());
		if (module > 0 && resolve_shader_modules)
		{
			auto module_iter = replayed_shader_modules.find(module);
			if (module_iter == replayed_shader_modules.end())
			{
				size_t external_state_size = 0;
				if (!resolver || !resolver->read_entry(RESOURCE_SHADER_MODULE, module, &external_state_size, nullptr,
				                                       PAYLOAD_READ_NO_FLAGS))
				{
					log_missing_resource("Shader module", module);
					return false;
				}

				vector<uint8_t> external_state(external_state_size);

				if (!resolver->read_entry(RESOURCE_SHADER_MODULE, module, &external_state_size, external_state.data(),
				                          PAYLOAD_READ_NO_FLAGS))
				{
					log_missing_resource("Shader module", module);
					return false;
				}

				if (!this->parse(iface, resolver, external_state.data(), external_state.size()))
					return false;

				iface.sync_shader_modules();
				module_iter = replayed_shader_modules.find(module);
				if (module_iter == replayed_shader_modules.end())
				{
					log_missing_resource("Shader module", module);
					return false;
				}
			}
			else
				iface.sync_shader_modules();

			state->module = module_iter->second;
		}
		else
			state->module = api_object_cast<VkShaderModule>(module);
	}

	*out_info = ret;
	return true;
}